

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintSmartPointer<pstore::dump::value,std::shared_ptr<pstore::dump::value>,void>
               (shared_ptr<pstore::dump::value> *ptr,ostream *os,int param_3)

{
  element_type *peVar1;
  ostream *poVar2;
  char *pcVar3;
  
  if ((ptr->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    pcVar3 = "(nullptr)";
  }
  else {
    poVar2 = std::operator<<(os,"(ptr = ");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    std::operator<<(poVar2,", value = ");
    peVar1 = (ptr->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar1->_vptr_value[0x13])(peVar1,os);
    pcVar3 = ")";
  }
  std::operator<<(os,pcVar3);
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, int) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    *os << "(ptr = " << (VoidifyPointer)(ptr.get()) << ", value = ";
    UniversalPrinter<T>::Print(*ptr, os);
    *os << ")";
  }
}